

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

uint32 __thiscall rw::MaterialList::streamGetSize(MaterialList *this)

{
  Material **ppMVar1;
  long lVar2;
  int iVar3;
  uint32 uVar4;
  long lVar5;
  uint32 uVar6;
  long lVar7;
  
  iVar3 = this->numMaterials;
  uVar6 = iVar3 * 4 + 0x10;
  if (0 < iVar3) {
    lVar7 = 0;
    do {
      ppMVar1 = this->materials;
      lVar5 = lVar7;
      do {
        if (lVar5 < 1) {
          uVar4 = Material::streamGetSize(ppMVar1[lVar7]);
          uVar6 = uVar6 + uVar4 + 0xc;
          iVar3 = this->numMaterials;
          break;
        }
        lVar2 = lVar5 + -1;
        lVar5 = lVar5 + -1;
      } while (ppMVar1[lVar7] != ppMVar1[lVar2]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar3);
  }
  return uVar6;
}

Assistant:

uint32
MaterialList::streamGetSize(void)
{
	uint32 size = 12 + 4 + this->numMaterials*4;
	for(int32 i = 0; i < this->numMaterials; i++){
		for(int32 j = i-1; j >= 0; j--)
			if(this->materials[i] == this->materials[j])
				goto found;
		size += 12 + this->materials[i]->streamGetSize();
		found:;
	}
	return size;
}